

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_5,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,__1,__1,_0,__1,__1> *rhs)

{
  Index otherSize;
  Index rowId;
  Scalar *_tri;
  Index triStride;
  Scalar *_other;
  Index otherStride;
  Matrix<double,__1,__1,_0,__1,__1> *in_RDI;
  BlockingType blocking;
  Index othersize;
  Index size;
  type actualLhs;
  DenseIndex in_stack_ffffffffffffff38;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *in_stack_ffffffffffffff40;
  DenseIndex in_stack_ffffffffffffff48;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *in_stack_ffffffffffffff50;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  level3_blocking<double,_double> local_70;
  Index local_28;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  ExtractType local_18;
  
  local_18 = blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(in_RDI);
  local_20 = (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2dcc59);
  local_28 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2dcc6e);
  rowId = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2dcc83);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2dcc95);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (DenseIndex)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  otherSize = local_28;
  this = local_20;
  _tri = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                   (local_20,rowId,(Index)in_stack_ffffffffffffff50);
  triStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)0x2dccef);
  _other = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                     (this,rowId,(Index)in_stack_ffffffffffffff50);
  otherStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                          ((Matrix<double,__1,__1,_0,__1,__1> *)0x2dcd1e);
  triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
            ((long)this,otherSize,_tri,triStride,_other,otherStride,&local_70);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::~gemm_blocking_space
            (in_stack_ffffffffffffff40);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }